

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O3

Iterator * __thiscall iDynTree::SensorsList::Iterator::operator++(Iterator *this)

{
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar1;
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  *pvVar2;
  pointer ppSVar3;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar4;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar5;
  Sensor **ppSVar6;
  
  pvVar1 = (this->externalIterator)._M_current;
  ppSVar6 = (this->internalIterator)._M_current + 1;
  (this->internalIterator)._M_current = ppSVar6;
  if ((pvVar1->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
      super__Vector_impl_data._M_finish <= ppSVar6) {
    pvVar2 = this->iteratingList;
    do {
      pvVar5 = pvVar1 + 1;
      (this->externalIterator)._M_current = pvVar5;
      if (pvVar5 == (pvVar2->
                    super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        return this;
      }
      ppSVar3 = (pvVar5->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = pvVar1 + 1;
      pvVar1 = pvVar5;
    } while (ppSVar3 ==
             (pvVar4->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
    (this->internalIterator)._M_current = ppSVar3;
  }
  return this;
}

Assistant:

SensorsList::Iterator& SensorsList::Iterator::operator++()
    {
        ++internalIterator;
        if (internalIterator >= externalIterator->end()) {
            //end of inner list.
            //Move to next list
            do {
                ++externalIterator;
            } while (externalIterator != iteratingList.end() &&
                     externalIterator->empty());

            if (externalIterator != iteratingList.end()) {
                internalIterator = externalIterator->begin();
            }
        }
        return *this;
    }